

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::InfixOperator::applyPoint
          (Interval *__return_storage_ptr__,InfixOperator *this,EvalContext *ctx,double x,double y)

{
  double this_00;
  int iVar1;
  byte local_49;
  Interval local_48;
  double local_30;
  double exact;
  double y_local;
  double x_local;
  EvalContext *ctx_local;
  InfixOperator *this_local;
  
  exact = y;
  y_local = x;
  x_local = (double)ctx;
  ctx_local = (EvalContext *)this;
  local_30 = (double)(**(code **)(*(long *)this + 0x68))(x,y);
  this_00 = x_local;
  tcu::Interval::Interval(&local_48,local_30);
  iVar1 = deIsInf(y_local);
  local_49 = 0;
  if (iVar1 == 0) {
    iVar1 = deIsInf(exact);
    local_49 = iVar1 != 0 ^ 0xff;
  }
  tcu::FloatFormat::roundOut
            (__return_storage_ptr__,(FloatFormat *)this_00,&local_48,(bool)(local_49 & 1));
  return __return_storage_ptr__;
}

Assistant:

Interval		applyPoint		(const EvalContext&	ctx,
									 double				x,
									 double				y) const
	{
		const double exact	= this->applyExact(x, y);

		// Allow either representable number on both sides of the exact value,
		// but require exactly representable values to be preserved.
		return ctx.format.roundOut(exact, !deIsInf(x) && !deIsInf(y));
	}